

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O2

void refreshMultiLine(linenoiseState *l,int flags)

{
  int __fd;
  char *__s;
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  size_t plen;
  size_t ini_pos;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uint i;
  string ab;
  char seq [64];
  
  __s = l->prompt;
  plen = strlen(__s);
  ini_pos = promptTextColumnLen(__s,plen);
  sVar4 = columnPosForMultiLine(l->buf,l->len,l->len,l->cols,ini_pos);
  uVar6 = l->cols;
  iVar7 = (int)l->oldrows;
  __fd = l->ofd;
  ab._M_dataplus._M_p = (pointer)&ab.field_2;
  ab._M_string_length = 0;
  ab.field_2._M_local_buf[0] = '\0';
  iVar3 = (int)((((long)(int)sVar4 + uVar6 + ini_pos) - 1) / uVar6);
  l->oldrows = (long)iVar3;
  if ((flags & 1U) != 0) {
    if ((int)((uVar6 + ini_pos + l->oldcolpos) / uVar6) < iVar7) {
      snprintf(seq,0x40,"\x1b[%dB");
      std::__cxx11::string::append((char *)&ab);
    }
    iVar5 = 1;
    if (1 < iVar7) {
      iVar5 = iVar7;
    }
    while (iVar5 = iVar5 + -1, iVar5 != 0) {
      builtin_strncpy(seq,"\r\x1b[0K\x1b[1A",10);
      std::__cxx11::string::append((char *)&ab);
    }
  }
  if ((flags & 3U) != 0) {
    builtin_strncpy(seq,"\r\x1b[0K",6);
    uVar2 = seq._0_4_;
    seq._0_8_ = CONCAT44(seq._4_4_,uVar2);
    std::__cxx11::string::append((char *)&ab);
  }
  sVar4 = columnPosForMultiLine(l->buf,l->len,l->pos,l->cols,ini_pos);
  iVar7 = (int)sVar4;
  if ((flags & 2U) != 0) {
    std::__cxx11::string::append((char *)&ab);
    if (maskmode == '\x01') {
      for (uVar6 = 0; uVar6 < l->len; uVar6 = (ulong)((int)uVar6 + 1)) {
        std::__cxx11::string::append((char *)&ab);
      }
    }
    else {
      std::__cxx11::string::append((char *)&ab,(ulong)l->buf);
    }
    refreshShowHints(&ab,l,(int)ini_pos);
    if (((l->pos != 0) && (l->pos == l->len)) && (((long)iVar7 + ini_pos) % l->cols == 0)) {
      std::__cxx11::string::append((char *)&ab);
      seq[0] = '\r';
      seq[1] = '\0';
      std::__cxx11::string::append((char *)&ab);
      iVar5 = iVar3 + 1;
      bVar1 = (int)l->oldrows <= iVar3;
      iVar3 = iVar5;
      if (bVar1) {
        l->oldrows = (long)iVar5;
      }
    }
    uVar6 = l->cols;
    if ((int)((uVar6 + ini_pos + (long)iVar7) / uVar6) < iVar3) {
      snprintf(seq,0x40,"\x1b[%dA");
      std::__cxx11::string::append((char *)&ab);
      uVar6 = l->cols;
    }
    if ((int)((ini_pos + (long)iVar7) % uVar6) == 0) {
      seq[0] = '\r';
      seq[1] = '\0';
    }
    else {
      snprintf(seq,0x40,"\r\x1b[%dC");
    }
    std::__cxx11::string::append((char *)&ab);
  }
  l->oldcolpos = (long)iVar7;
  write(__fd,ab._M_dataplus._M_p,ab._M_string_length);
  std::__cxx11::string::~string((string *)&ab);
  return;
}

Assistant:

static void refreshMultiLine(struct linenoiseState *l, int flags) {
    char seq[64];
    size_t      pcollen = promptTextColumnLen(l->prompt, strlen(l->prompt));
    int         colpos  = columnPosForMultiLine(l->buf, l->len, l->len, l->cols, pcollen);
    int         colpos2;                                             /* cursor column position. */
    int         rows = (pcollen + colpos + l->cols - 1) / l->cols;   /* rows used by current buf. */
    int         rpos = (pcollen + l->oldcolpos + l->cols) / l->cols; /* cursor relative row. */
    int rpos2; /* rpos after refresh. */
    int         col;   /* column position, zero-based. */
    int old_rows = l->oldrows;
    int fd = l->ofd, j;
    std::string ab;
    l->oldrows = rows;

    /* First step: clear all the lines used before. To do so start by
     * going to the last row. */
    if (flags & REFRESH_CLEAN) {
        if (old_rows - rpos > 0) {
            snprintf(seq,64,"\x1b[%dB", old_rows-rpos);
            ab.append(seq);
        }

        /* Now for every row clear it, go up. */
        for (j = 0; j < old_rows - 1; j++) {
            snprintf(seq,64,"\r\x1b[0K\x1b[1A");
            ab.append(seq);
        }
    }

    if (flags & REFRESH_ALL) {
        /* Clean the top line. */
        snprintf(seq,64,"\r\x1b[0K");
        ab.append(seq);
    }

    /* Get column length to cursor position */
    colpos2 = columnPosForMultiLine(l->buf, l->len, l->pos, l->cols, pcollen);

    if (flags & REFRESH_WRITE) {
        /* Write the prompt and the current buffer content */
        ab.append(l->prompt);
        if (maskmode == 1) {
            for (unsigned int i = 0; i < l->len; ++i) {
                ab.append("*");
            }
        } else {
            ab.append(l->buf, l->len);
        }

        /* Show hits if any. */
        refreshShowHints(ab, l, pcollen);

        /* If we are at the very end of the screen with our prompt, we need to
         * emit a newline and move the prompt to the first column. */
        if (l->pos && l->pos == l->len && (colpos2 + pcollen) % l->cols == 0) {
            ab.append("\n");
            snprintf(seq,64,"\r");
            ab.append(seq);
            rows++;
            if (rows > (int)l->oldrows) l->oldrows = rows;
        }

        /* Move cursor to right position. */
        rpos2 = (pcollen + colpos2 + l->cols) / l->cols; /* Current cursor relative row */

        /* Go up till we reach the expected position. */
        if (rows - rpos2 > 0) {
            snprintf(seq,64,"\x1b[%dA", rows-rpos2);
            ab.append(seq);
        }

        /* Set column. */
        col = (pcollen + colpos2) % l->cols;
        if (col)
            snprintf(seq,64,"\r\x1b[%dC", col);
        else
            snprintf(seq,64,"\r");
        ab.append(seq);
    }

    l->oldcolpos = colpos2;

    (void) !write(fd, ab.c_str(), ab.size()); /* Can't recover from write error. */
}